

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

mraa_boolean_t mraa_link_targets(char *filename,char *targetname)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ssize_t sVar4;
  int iVar5;
  char *__haystack;
  
  iVar5 = 100;
  uVar2 = 0;
  __haystack = (char *)0x0;
  while( true ) {
    if (uVar2 != 0) {
      pcVar3 = strstr(__haystack,targetname);
      free(__haystack);
      return (uint)(pcVar3 != (char *)0x0);
    }
    pcVar3 = (char *)realloc(__haystack,(long)iVar5);
    if (pcVar3 == (char *)0x0) break;
    sVar4 = readlink(filename,pcVar3,(long)iVar5);
    uVar2 = (uint)sVar4;
    __haystack = pcVar3;
    if ((int)uVar2 < 0) break;
    pcVar3[uVar2 & 0x7fffffff] = '\0';
    bVar1 = iVar5 <= (int)uVar2;
    if (iVar5 <= (int)uVar2) {
      uVar2 = 0;
    }
    iVar5 = iVar5 << bVar1;
  }
  free(__haystack);
  return 0;
}

Assistant:

mraa_boolean_t
mraa_link_targets(const char* filename, const char* targetname)
{
    int size = 100;
    int nchars = 0;
    char* buffer = NULL;
    while (nchars == 0) {
        char* old_buffer = buffer;
        buffer = (char*) realloc(buffer, size);
        if (buffer == NULL) {
            free(old_buffer);
            return 0;
        }
        nchars = readlink(filename, buffer, size);
        if (nchars < 0) {
            free(buffer);
            return 0;
        } else {
            buffer[nchars] = '\0';
        }
        if (nchars >= size) {
            size *= 2;
            nchars = 0;
        }
    }
    if (strstr(buffer, targetname)) {
        free(buffer);
        return 1;
    } else {
        free(buffer);
        return 0;
    }
}